

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

bool __thiscall
Diligent::VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
          (Diligent *this,PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,
          BufferViewVkImpl *pViewImpl,initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes
          ,RESOURCE_DIMENSION ExpectedResourceDimension,bool IsMultisample,
          IDeviceObject *pCachedView,char *SignatureName)

{
  BUFFER_VIEW_TYPE ViewType;
  BUFFER_VIEW_TYPE ViewType_00;
  long lVar1;
  bool bVar2;
  bool bVar3;
  iterator pBVar4;
  ostream *poVar5;
  Char *pCVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  undefined7 in_stack_00000011;
  RESOURCE_DIMENSION local_214;
  string msg;
  Diligent local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  bVar2 = VerifyResourceBinding<Diligent::BufferViewVkImpl>
                    ("buffer view",(PipelineResourceDesc *)this,(BindResourceInfo *)ResDesc,
                     (BufferViewVkImpl *)BindInfo,
                     (IDeviceObject *)CONCAT71(in_stack_00000011,IsMultisample),(char *)pCachedView)
  ;
  if (BindInfo != (BindResourceInfo *)0x0) {
    ViewType = *(BUFFER_VIEW_TYPE *)&BindInfo[1].pObject;
    bVar3 = false;
    for (pBVar4 = (iterator)0x0; ExpectedViewTypes._M_array != pBVar4; pBVar4 = pBVar4 + 1) {
      bVar3 = (bool)(bVar3 | pBVar4[(long)&pViewImpl->
                                           super_BufferViewBase<Diligent::EngineVkImplTraits>] ==
                             ViewType);
    }
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a8,"Error binding ");
      poVar5 = std::operator<<(poVar5,"buffer view");
      poVar5 = std::operator<<(poVar5," \'");
      poVar5 = std::operator<<(poVar5,(char *)BindInfo->BufferRangeSize);
      poVar5 = std::operator<<(poVar5,"\' to variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                (&msg,(PipelineResourceDesc *)this,ResDesc->ArraySize);
      poVar5 = std::operator<<(poVar5,(string *)&msg);
      std::operator<<(poVar5,'\'');
      std::__cxx11::string::~string((string *)&msg);
      if (pCachedView != (IDeviceObject *)0x0) {
        poVar5 = std::operator<<(local_1a8," defined by signature \'");
        poVar5 = std::operator<<(poVar5,(char *)pCachedView);
        std::operator<<(poVar5,'\'');
      }
      std::operator<<(local_1a8,". Incorrect view type: ");
      bVar2 = true;
      for (pBVar4 = (iterator)0x0; ExpectedViewTypes._M_array != pBVar4; pBVar4 = pBVar4 + 1) {
        ViewType_00 = pBVar4[(long)&pViewImpl->super_BufferViewBase<Diligent::EngineVkImplTraits>];
        if (!bVar2) {
          std::operator<<(local_1a8," or ");
        }
        pCVar6 = GetBufferViewTypeLiteralName(ViewType_00);
        std::operator<<(local_1a8,pCVar6);
        bVar2 = false;
      }
      poVar5 = std::operator<<(local_1a8," is expected, ");
      pCVar6 = GetBufferViewTypeLiteralName(ViewType);
      poVar5 = std::operator<<(poVar5,pCVar6);
      std::operator<<(poVar5," is provided.");
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&msg,local_1d8,Args);
      std::__cxx11::string::~string((string *)local_1d8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyResourceViewBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x1bf);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      bVar2 = false;
    }
    local_214 = (RESOURCE_DIMENSION)ExpectedViewTypes._M_len;
    bVar3 = ValidateResourceViewDimension<Diligent::BufferViewVkImpl>
                      (*(char **)this,*(Uint32 *)(this + 0xc),ResDesc->ArraySize,
                       (BufferViewVkImpl *)BindInfo,local_214,(bool)ExpectedResourceDimension);
    bVar2 = (bool)(bVar2 & bVar3);
  }
  lVar1._0_1_ = ResDesc->ResourceType;
  lVar1._1_1_ = ResDesc->VarType;
  lVar1._2_1_ = ResDesc->Flags;
  lVar1._3_1_ = ResDesc->field_0x13;
  lVar1._4_1_ = (ResDesc->WebGPUAttribs).BindingType;
  lVar1._5_1_ = (ResDesc->WebGPUAttribs).TextureViewDim;
  lVar1._6_2_ = (ResDesc->WebGPUAttribs).UAVTextureFormat;
  if (ResDesc[1].Name != (Char *)0x0 || lVar1 != 0) {
    FormatString<char[132]>
              ((string *)&ss,
               (char (*) [132])
               "Buffer range may only be directly specified for constant buffers. To specify a range for a structured buffer, create a buffer view."
              );
    DebugAssertionFailed
              (_ss,"VerifyResourceViewBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x1cd);
    std::__cxx11::string::~string((string *)&ss);
  }
  return bVar2;
}

Assistant:

bool VerifyResourceViewBinding(const PipelineResourceDesc&             ResDesc,
                               const BindResourceInfo&                 BindInfo,
                               const ResourceViewImplType*             pViewImpl,
                               std::initializer_list<ViewTypeEnumType> ExpectedViewTypes,
                               RESOURCE_DIMENSION                      ExpectedResourceDimension,
                               bool                                    IsMultisample,
                               const IDeviceObject*                    pCachedView,
                               const char*                             SignatureName)
{
    const char* ExpectedResourceType = GetResourceTypeName<ViewTypeEnumType>();

    bool BindingOK = VerifyResourceBinding(ExpectedResourceType, ResDesc, BindInfo, pViewImpl, pCachedView, SignatureName);

    if (pViewImpl)
    {
        ViewTypeEnumType ViewType           = pViewImpl->GetDesc().ViewType;
        bool             IsExpectedViewType = false;
        for (ViewTypeEnumType ExpectedViewType : ExpectedViewTypes)
        {
            if (ExpectedViewType == ViewType)
                IsExpectedViewType = true;
        }

        if (!IsExpectedViewType)
        {
            std::stringstream ss;
            ss << "Error binding " << ExpectedResourceType << " '" << pViewImpl->GetDesc().Name << "' to variable '"
               << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". Incorrect view type: ";
            bool IsFirstViewType = true;
            for (ViewTypeEnumType ExpectedViewType : ExpectedViewTypes)
            {
                if (!IsFirstViewType)
                {
                    ss << " or ";
                }
                ss << GetViewTypeLiteralName(ExpectedViewType);
                IsFirstViewType = false;
            }
            ss << " is expected, " << GetViewTypeLiteralName(ViewType) << " is provided.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        if (!ValidateResourceViewDimension(ResDesc.Name, ResDesc.ArraySize, BindInfo.ArrayIndex, pViewImpl, ExpectedResourceDimension, IsMultisample))
        {
            BindingOK = false;
        }
    }

    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range may only be directly specified for constant buffers. "
                                    "To specify a range for a structured buffer, create a buffer view.");
    }

    return BindingOK;
}